

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

void traverse_hplane<PredictionData<double,long>,long,ImputedData<long,long_double>>
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane,ExtIsoForest *model_outputs,
               PredictionData<double,_long> *prediction_data,double *output_depth,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes,
               ImputedData<long,_long_double> *imputed_data,long *tree_num,double *tree_depth,
               size_t row)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t *psVar4;
  unsigned_long uVar5;
  size_t sVar6;
  pointer puVar7;
  unsigned_long uVar8;
  uint uVar9;
  pointer pIVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double local_a0;
  
  uVar9 = 2;
  if ((prediction_data->Xr_indptr == (long *)0x0) &&
     (uVar9 = 3, prediction_data->Xc_indptr == (long *)0x0)) {
    uVar9 = (uint)prediction_data->is_col_major;
  }
  pIVar10 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pIVar10->hplane_left == 0) {
    sVar6 = 0;
  }
  else {
    local_a0 = *output_depth;
    sVar6 = 0;
    do {
      pIVar10 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 = *(pointer *)
                &pIVar10[sVar6].col_num.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      bVar15 = *(pointer *)
                ((long)&pIVar10[sVar6].col_num.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                8) == puVar7;
      bVar14 = !bVar15;
      if (bVar15) {
        dVar17 = 0.0;
      }
      else {
        dVar17 = 0.0;
        uVar13 = 0;
        lVar12 = 0;
        do {
          iVar1 = *(int *)(*(long *)&pIVar10[sVar6].col_type.
                                     super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
                                     super__Vector_impl_data + uVar13 * 4);
          if (iVar1 == 0x20) {
            uVar8 = puVar7[uVar13];
            psVar4 = &prediction_data->ncols_categ;
            uVar5 = row;
            if (prediction_data->is_col_major != false) {
              uVar8 = row;
              psVar4 = &prediction_data->nrows;
              uVar5 = puVar7[uVar13];
            }
            iVar1 = prediction_data->categ_data[uVar5 * *psVar4 + uVar8];
            if ((long)iVar1 < 0) {
              if (model_outputs->missing_action == Fail) {
                *output_depth = NAN;
                local_a0 = NAN;
                break;
              }
              dVar17 = dVar17 + *(double *)
                                 (*(long *)&pIVar10[sVar6].fill_val.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data + uVar13 * 8);
            }
            else if (model_outputs->cat_split_type == SubSet) {
              lVar2 = *(long *)&pIVar10[sVar6].cat_coef.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              lVar3 = *(long *)(lVar2 + lVar12 * 0x18);
              iVar11 = (int)((ulong)(*(long *)(lVar2 + 8 + lVar12 * 0x18) - lVar3) >> 3);
              if (iVar1 < iVar11) {
                dVar16 = *(double *)(lVar3 + (long)iVar1 * 8);
              }
              else if (model_outputs->new_cat_action == Random) {
                dVar16 = *(double *)(lVar3 + ((long)iVar1 % (long)iVar11 & 0xffffffffU) * 8);
              }
              else {
                dVar16 = *(double *)
                          (*(long *)&pIVar10[sVar6].fill_new.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + lVar12 * 8);
              }
              dVar17 = dVar17 + dVar16;
            }
            else if (model_outputs->cat_split_type == SingleCateg) {
              dVar16 = 0.0;
              if (iVar1 == *(int *)(*(long *)&pIVar10[sVar6].chosen_cat.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + lVar12 * 4)) {
                dVar16 = *(double *)
                          (*(long *)&pIVar10[sVar6].fill_new.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + lVar12 * 8);
              }
              dVar17 = dVar17 + dVar16;
            }
            lVar12 = lVar12 + 1;
          }
          else if (iVar1 == 0x1f) {
            (*(code *)(&DAT_0036b4ec + *(int *)(&DAT_0036b4ec + (ulong)uVar9 * 4)))();
            return;
          }
          uVar13 = uVar13 + 1;
          pIVar10 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          puVar7 = *(pointer *)
                    &pIVar10[sVar6].col_num.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
          bVar14 = uVar13 < (ulong)((long)*(pointer *)
                                           ((long)&pIVar10[sVar6].col_num.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 8) - (long)puVar7 >> 3);
        } while (bVar14);
      }
      if (bVar14) {
        return;
      }
      pIVar10 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start;
      dVar16 = 1.0;
      if (pIVar10[sVar6].range_low <= dVar17) {
        dVar16 = (double)(-(ulong)(pIVar10[sVar6].range_high < dVar17) & 0x3ff0000000000000);
      }
      local_a0 = local_a0 - dVar16;
      *output_depth = local_a0;
      sVar6 = (&pIVar10[sVar6].hplane_left)[pIVar10[sVar6].split_point < dVar17];
      pIVar10 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (pIVar10[sVar6].hplane_left != 0);
    pIVar10 = pIVar10 + sVar6;
  }
  dVar17 = pIVar10->score;
  *output_depth = *output_depth + dVar17;
  if (tree_num != (long *)0x0) {
    tree_num[row] = sVar6;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = dVar17;
  }
  if (imputed_data == (ImputedData<long,_long_double> *)0x0) {
    return;
  }
  add_from_impute_node<ImputedData<long,long_double>>
            ((impute_nodes->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start + sVar6,imputed_data,1.0);
  return;
}

Assistant:

void traverse_hplane(std::vector<IsoHPlane>   &hplane,
                     ExtIsoForest             &model_outputs,
                     PredictionData           &prediction_data,
                     double &restrict         output_depth,
                     std::vector<ImputeNode> *impute_nodes,     /* only when imputing missing */
                     ImputedData             *imputed_data,     /* only when imputing missing */
                     sparse_ix *restrict      tree_num,
                     double *restrict         tree_depth,
                     size_t                   row) noexcept
{
    size_t  curr_lev = 0;
    double  xval;
    int     cval;
    double  hval;

    size_t ncols_numeric, ncols_categ;

    NumericConfig numeric_config;
    if (prediction_data.Xr_indptr != NULL)
        numeric_config = SparseCSR;
    else if (prediction_data.Xc_indptr != NULL)
        numeric_config = SparseCSC;
    else if (prediction_data.is_col_major)
        numeric_config = DenseColMajor;
    else
        numeric_config = DenseRowMajor;

    sparse_ix *row_st = NULL, *row_end = NULL;
    size_t lb, ub;
    if (numeric_config == SparseCSR)
    {
        row_st  = prediction_data.Xr_ind + prediction_data.Xr_indptr[row];
        row_end = prediction_data.Xr_ind + prediction_data.Xr_indptr[row + 1];
        lb = *row_st;
        ub = *(row_end-1);
    }

    while (true)
    {
        // if (hplane[curr_lev].score > 0)
        if (unlikely(hplane[curr_lev].hplane_left == 0))
        {
            output_depth += hplane[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = hplane[curr_lev].score;
            if (unlikely(imputed_data != NULL))
            {
                add_from_impute_node((*impute_nodes)[curr_lev], *imputed_data, (double)1);
            }
            return;
        }

        else
        {
            hval = 0;
            ncols_numeric = 0; ncols_categ = 0;
            for (size_t col = 0; col < hplane[curr_lev].col_num.size(); col++)
            {
                switch(hplane[curr_lev].col_type[col])
                {
                    case Numeric:
                    {
                        switch(numeric_config)
                        {
                            case DenseRowMajor:
                            {
                                xval = prediction_data.numeric_data[hplane[curr_lev].col_num[col] + row * prediction_data.ncols_numeric];
                                break;
                            }

                            case DenseColMajor:
                            {
                                xval = prediction_data.numeric_data[row +  hplane[curr_lev].col_num[col] * prediction_data.nrows];
                                break;
                            }

                            case SparseCSR:
                            {
                                xval = extract_spR(prediction_data, row_st, row_end, hplane[curr_lev].col_num[col], lb, ub);
                                break;
                            }

                            case SparseCSC:
                            {
                                xval = extract_spC(prediction_data, row, hplane[curr_lev].col_num[col]);
                                break;
                            }
                        }

                        if (unlikely(is_na_or_inf(xval)))
                        {
                            if (model_outputs.missing_action != Fail)
                            {
                                hval += hplane[curr_lev].fill_val[col];
                            }

                            else
                            {
                                output_depth = NAN;
                                return;
                            }
                        }

                        else
                        {
                            hval += (xval - hplane[curr_lev].mean[ncols_numeric]) * hplane[curr_lev].coef[ncols_numeric];
                        }

                        ncols_numeric++;
                        break;
                    }

                    case Categorical:
                    {
                        cval = prediction_data.categ_data[
                            prediction_data.is_col_major?
                            (row +  hplane[curr_lev].col_num[col] * prediction_data.nrows)
                                :
                            (hplane[curr_lev].col_num[col] + row * prediction_data.ncols_categ)
                        ];
                        if (unlikely(cval < 0))
                        {
                            if (model_outputs.missing_action != Fail)
                            {
                                hval += hplane[curr_lev].fill_val[col];
                            }
                            
                            else
                            {
                                output_depth = NAN;
                                return;
                            }
                        }

                        else
                        {
                            switch(model_outputs.cat_split_type)
                            {
                                case SingleCateg:
                                {
                                    hval += (cval == hplane[curr_lev].chosen_cat[ncols_categ])? hplane[curr_lev].fill_new[ncols_categ] : 0;
                                    break;
                                }

                                case SubSet:
                                {
                                    if (unlikely(cval >= (int)hplane[curr_lev].cat_coef[ncols_categ].size()))
                                    {
                                        if (model_outputs.new_cat_action == Random) {
                                            cval = cval % (int)hplane[curr_lev].cat_coef[ncols_categ].size();
                                            hval += hplane[curr_lev].cat_coef[ncols_categ][cval];
                                        }

                                        else {
                                            hval += hplane[curr_lev].fill_new[ncols_categ];
                                        }
                                    }
                                    
                                    else
                                    {
                                        hval += hplane[curr_lev].cat_coef[ncols_categ][cval];
                                    }
                                    
                                    break;
                                }
                            }
                        }

                        ncols_categ++;
                        break;
                    }

                    default:
                    {
                        assert(0);
                        break;
                    }
                }

            }

            output_depth -= (hval < hplane[curr_lev].range_low) ||
                            (hval > hplane[curr_lev].range_high);
            curr_lev       = (hval <= hplane[curr_lev].split_point)?
                             hplane[curr_lev].hplane_left : hplane[curr_lev].hplane_right;
        }
    }
}